

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsDenseDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                   ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1)

{
  int iVar1;
  sunindextype sVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  sunrealtype *psVar6;
  long j;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_a8;
  long local_a0;
  double local_90;
  
  sVar2 = SUNDenseMatrix_Columns(Jac);
  uVar3 = N_VCloneEmpty(tmp1);
  lVar4 = N_VGetArrayPointer(ark_mem->ewt);
  lVar5 = N_VGetArrayPointer(y);
  if (ark_mem->constraintsSet == 0) {
    local_a0 = 0;
  }
  else {
    local_a0 = N_VGetArrayPointer(ark_mem->constraints);
  }
  dVar7 = ark_mem->uround;
  local_a8 = 0.0;
  if (0.0 < dVar7) {
    if (dVar7 < 0.0) {
      local_a8 = sqrt(dVar7);
    }
    else {
      local_a8 = SQRT(dVar7);
    }
  }
  dVar7 = (double)N_VWrmsNorm(fy,ark_mem->rwt);
  local_90 = 1.0;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_90 = dVar7 * (double)sVar2 * ABS(ark_mem->h) * 1000.0 * ark_mem->uround;
  }
  if (sVar2 < 1) {
    sVar2 = 0;
  }
  for (j = 0; sVar2 != j; j = j + 1) {
    psVar6 = SUNDenseMatrix_Column(Jac,j);
    N_VSetArrayPointer(psVar6,uVar3);
    dVar7 = *(double *)(lVar5 + j * 8);
    dVar8 = local_90 / *(double *)(lVar4 + j * 8);
    dVar10 = ABS(dVar7) * local_a8;
    if (ABS(dVar7) * local_a8 <= dVar8) {
      dVar10 = dVar8;
    }
    if (ark_mem->constraintsSet != 0) {
      dVar8 = *(double *)(local_a0 + j * 8);
      dVar9 = ABS(dVar8);
      if ((dVar9 != 1.0) || (NAN(dVar9))) {
        if ((dVar9 == 2.0) && ((!NAN(dVar9) && ((dVar7 + dVar10) * dVar8 <= 0.0))))
        goto LAB_0013a3a5;
      }
      else if ((dVar7 + dVar10) * dVar8 < 0.0) {
LAB_0013a3a5:
        dVar10 = -dVar10;
      }
    }
    *(double *)(lVar5 + j * 8) = dVar7 + dVar10;
    iVar1 = (*fi)(t,y,tmp1,ark_mem->user_data);
    arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
    if (iVar1 != 0) goto LAB_0013a435;
    *(double *)(lVar5 + j * 8) = dVar7;
    N_VLinearSum(1.0 / dVar10,-(1.0 / dVar10),tmp1,fy,uVar3);
  }
  iVar1 = 0;
LAB_0013a435:
  N_VSetArrayPointer(0,uVar3);
  N_VDestroy(uVar3);
  return iVar1;
}

Assistant:

int arkLsDenseDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                    ARKodeMem ark_mem, ARKLsMem arkls_mem, ARKRhsFn fi,
                    N_Vector tmp1)
{
  sunrealtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  sunrealtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  int retval = 0;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for various vectors */
  ewt_data = N_VGetArrayPointer(ark_mem->ewt);
  y_data   = N_VGetArrayPointer(y);
  cns_data = (ark_mem->constraintsSet) ? N_VGetArrayPointer(ark_mem->constraints)
                                       : NULL;

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(ark_mem->uround);
  fnorm  = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO)
             ? (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm)
             : ONE;

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);

    yjsaved = y_data[j];
    inc     = SUNMAX(srur * SUNRabs(yjsaved), minInc / ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (ark_mem->constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yjsaved + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yjsaved + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    y_data[j] += inc;

    retval = fi(t, y, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) { break; }

    y_data[j] = yjsaved;

    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}